

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O2

int8_t icu_63::compareUnicodeString(UElement t1,UElement t2)

{
  int8_t iVar1;
  int32_t thisLength;
  int32_t srcLength;
  
  if (*(short *)((long)t1.pointer + 8) < 0) {
    thisLength = *(int32_t *)((long)t1.pointer + 0xc);
  }
  else {
    thisLength = (int)*(short *)((long)t1.pointer + 8) >> 5;
  }
  if (*(short *)((long)t2.pointer + 8) < 0) {
    srcLength = *(int32_t *)((long)t2.pointer + 0xc);
  }
  else {
    srcLength = (int)*(short *)((long)t2.pointer + 8) >> 5;
  }
  iVar1 = UnicodeString::doCompare
                    ((UnicodeString *)t1.pointer,0,thisLength,(UnicodeString *)t2.pointer,0,
                     srcLength);
  return iVar1;
}

Assistant:

static int8_t U_CALLCONV compareUnicodeString(UElement t1, UElement t2) {
    const UnicodeString &a = *(const UnicodeString*)t1.pointer;
    const UnicodeString &b = *(const UnicodeString*)t2.pointer;
    return a.compare(b);
}